

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *it,uint32_t *buf,uint32_t count)

{
  uint8_t uVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong *puVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint32_t uVar15;
  bool bVar16;
  
  bVar5 = it->has_value;
  uVar15 = 0;
  if (count != 0 && (_Bool)bVar5 == true) {
    uVar15 = 0;
    do {
      uVar1 = it->typecode;
      if (uVar1 == '\x03') {
        piVar3 = (int *)it->container;
        lVar2 = *(long *)(piVar3 + 2);
        uVar8 = it->current_value;
        do {
          uVar13 = (uint)*(ushort *)(lVar2 + 2 + (long)it->run_index * 4) +
                   (uint)*(ushort *)(lVar2 + (long)it->run_index * 4) | it->highbits;
          uVar12 = (uVar13 - uVar8) + 1;
          uVar9 = count - uVar15;
          if (uVar12 < count - uVar15) {
            uVar9 = uVar12;
          }
          if (uVar9 == 0) {
            uVar7 = 0;
          }
          else {
            uVar7 = (ulong)uVar9;
            uVar11 = 0;
            do {
              buf[uVar11] = it->current_value + (int)uVar11;
              uVar11 = uVar11 + 1;
            } while (uVar7 != uVar11);
            uVar8 = it->current_value;
          }
          iVar6 = uVar8 + uVar9;
          uVar8 = uVar8 + uVar9;
          it->current_value = uVar8;
          if (uVar13 <= iVar6 - 1U) {
            iVar6 = it->run_index;
            iVar14 = iVar6 + 1;
            it->run_index = iVar14;
            if (iVar14 < *piVar3) {
              uVar8 = (uint)*(ushort *)(lVar2 + 4 + (long)iVar6 * 4) | it->highbits;
              it->current_value = uVar8;
            }
            else {
              it->has_value = false;
              bVar5 = 0;
            }
          }
          buf = buf + uVar7;
          uVar15 = uVar15 + uVar9;
        } while ((uVar15 < count) && ((bVar5 & 1) != 0));
        if ((bVar5 & 1) != 0) goto LAB_0011a3a7;
      }
      else if (uVar1 == '\x02') {
        piVar3 = (int *)it->container;
        iVar14 = *piVar3;
        iVar6 = it->in_container_index;
        uVar8 = count - uVar15;
        if ((uint)(iVar14 - iVar6) < count - uVar15) {
          uVar8 = iVar14 - iVar6;
        }
        if (uVar8 == 0) {
          uVar7 = 0;
        }
        else {
          lVar2 = *(long *)(piVar3 + 2);
          uVar7 = (ulong)uVar8;
          uVar11 = 0;
          do {
            buf[uVar11] = (uint)*(ushort *)
                                 (lVar2 + (ulong)(uint)(it->in_container_index + (int)uVar11) * 2) |
                          it->highbits;
            uVar11 = uVar11 + 1;
          } while (uVar7 != uVar11);
          iVar6 = it->in_container_index;
          iVar14 = *piVar3;
        }
        uVar15 = uVar15 + uVar8;
        iVar6 = iVar6 + uVar8;
        it->in_container_index = iVar6;
        it->has_value = iVar6 < iVar14;
        if (iVar6 < iVar14) {
          uVar8 = (uint)*(ushort *)(*(long *)(piVar3 + 2) + (long)iVar6 * 2);
          goto LAB_0011a39f;
        }
        buf = buf + uVar7;
      }
      else {
        if (uVar1 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x41b3,
                        "uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *, uint32_t *, uint32_t)"
                       );
        }
        iVar6 = it->in_container_index;
        iVar14 = iVar6 + 0x3f;
        if (-1 < iVar6) {
          iVar14 = iVar6;
        }
        uVar11 = (ulong)(uint)(iVar14 >> 6);
        lVar2 = *(long *)((long)it->container + 8);
        uVar7 = (*(ulong *)(lVar2 + uVar11 * 8) >> ((byte)iVar6 & 0x3f)) << ((byte)iVar6 & 0x3f);
        do {
          bVar16 = uVar15 < count;
          if ((uVar7 != 0) && (uVar15 < count)) {
            do {
              lVar4 = 0;
              if (uVar7 != 0) {
                for (; (uVar7 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                }
              }
              *buf = (uint)lVar4 | (int)uVar11 << 6 | it->highbits;
              buf = buf + 1;
              uVar15 = uVar15 + 1;
              bVar16 = uVar15 < count;
              uVar7 = uVar7 - 1 & uVar7;
            } while ((uVar7 != 0) && (uVar15 < count));
          }
          if ((uVar7 == 0) && (uVar8 = (int)uVar11 + 1, uVar8 < 0x400)) {
            puVar10 = (ulong *)(lVar2 + (ulong)uVar8 * 8);
            do {
              uVar8 = (int)uVar11 + 1;
              uVar11 = (ulong)uVar8;
              uVar7 = *puVar10;
              if (uVar7 != 0) break;
              puVar10 = puVar10 + 1;
            } while (uVar8 < 0x3ff);
          }
        } while ((bool)(uVar7 != 0 & bVar16));
        it->has_value = uVar7 != 0;
        if (uVar7 != 0) {
          lVar2 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          uVar8 = (uint)lVar2 | (int)uVar11 << 6;
          it->in_container_index = uVar8;
LAB_0011a39f:
          it->current_value = uVar8 | it->highbits;
LAB_0011a3a7:
          if (uVar15 == count) {
            return count;
          }
          __assert_fail("ret == count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x41b6,
                        "uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *, uint32_t *, uint32_t)"
                       );
        }
      }
      it->container_index = it->container_index + 1;
      bVar5 = loadfirstvalue(it);
      it->has_value = (_Bool)bVar5;
    } while (((bool)bVar5) && (uVar15 < count));
  }
  return uVar15;
}

Assistant:

uint32_t roaring_read_uint32_iterator(roaring_uint32_iterator_t *it, uint32_t* buf, uint32_t count) {
  uint32_t ret = 0;
  uint32_t num_values;
  uint32_t wordindex;  // used for bitsets
  uint64_t word;       // used for bitsets
  const array_container_t* acont; //TODO remove
  const run_container_t* rcont; //TODO remove
  const bitset_container_t* bcont; //TODO remove

  while (it->has_value && ret < count) {
    switch (it->typecode) {
      case BITSET_CONTAINER_TYPE:
        bcont = const_CAST_bitset(it->container);
        wordindex = it->in_container_index / 64;
        word = bcont->words[wordindex] & (UINT64_MAX << (it->in_container_index % 64));
        do {
          while (word != 0 && ret < count) {
            buf[0] = it->highbits | (wordindex * 64 + __builtin_ctzll(word));
            word = word & (word - 1);
            buf++;
            ret++;
          }
          while (word == 0 && wordindex+1 < BITSET_CONTAINER_SIZE_IN_WORDS) {
            wordindex++;
            word = bcont->words[wordindex];
          }
        } while (word != 0 && ret < count);
        it->has_value = (word != 0);
        if (it->has_value) {
          it->in_container_index = wordindex * 64 + __builtin_ctzll(word);
          it->current_value = it->highbits | it->in_container_index;
        }
        break;
      case ARRAY_CONTAINER_TYPE:
        acont = const_CAST_array(it->container);
        num_values = minimum_uint32(acont->cardinality - it->in_container_index, count - ret);
        for (uint32_t i = 0; i < num_values; i++) {
          buf[i] = it->highbits | acont->array[it->in_container_index + i];
        }
        buf += num_values;
        ret += num_values;
        it->in_container_index += num_values;
        it->has_value = (it->in_container_index < acont->cardinality);
        if (it->has_value) {
          it->current_value = it->highbits | acont->array[it->in_container_index];
        }
        break;
      case RUN_CONTAINER_TYPE:
        rcont = const_CAST_run(it->container);
        //"in_run_index" name is misleading, read it as "max_value_in_current_run"
        do {
          uint32_t largest_run_value = it->highbits | (rcont->runs[it->run_index].value + rcont->runs[it->run_index].length);
          num_values = minimum_uint32(largest_run_value - it->current_value + 1, count - ret);
          for (uint32_t i = 0; i < num_values; i++) {
            buf[i] = it->current_value + i;
          }
          it->current_value += num_values; // this can overflow to zero: UINT32_MAX+1=0
          buf += num_values;
          ret += num_values;

          if (it->current_value > largest_run_value || it->current_value == 0) {
            it->run_index++;
            if (it->run_index < rcont->n_runs) {
              it->current_value = it->highbits | rcont->runs[it->run_index].value;
            } else {
              it->has_value = false;
            }
          }
        } while ((ret < count) && it->has_value);
        break;
      default:
        assert(false);
    }
    if (it->has_value) {
      assert(ret == count);
      return ret;
    }
    it->container_index++;
    it->has_value = loadfirstvalue(it);
  }
  return ret;
}